

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::GenerateBlockSymbol*>::
emplaceRealloc<slang::ast::GenerateBlockSymbol*const&>
          (SmallVectorBase<slang::ast::GenerateBlockSymbol*> *this,pointer pos,
          GenerateBlockSymbol **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppGVar3;
  GenerateBlockSymbol **__result;
  GenerateBlockSymbol **ppGVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  GenerateBlockSymbol **args_local;
  pointer pos_local;
  SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::max_size
                    ((SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::calculateGrowth
                       ((SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)this,
                        *(long *)(this + 8) + 1);
  ppGVar3 = SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::begin
                      ((SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)this);
  __result = (GenerateBlockSymbol **)slang::detail::allocArray(capacity,8);
  ppGVar4 = __result + ((long)pos - (long)ppGVar3 >> 3);
  *ppGVar4 = *args;
  ppGVar3 = SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::end
                      ((SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)this);
  if (pos == ppGVar3) {
    ppGVar3 = SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::begin
                        ((SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::end
                    ((SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)this);
    std::uninitialized_move<slang::ast::GenerateBlockSymbol**,slang::ast::GenerateBlockSymbol**>
              (ppGVar3,(GenerateBlockSymbol **)ctx,__result);
  }
  else {
    ppGVar3 = SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::begin
                        ((SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)this);
    std::uninitialized_move<slang::ast::GenerateBlockSymbol**,slang::ast::GenerateBlockSymbol**>
              (ppGVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::end
                    ((SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)this);
    std::uninitialized_move<slang::ast::GenerateBlockSymbol**,slang::ast::GenerateBlockSymbol**>
              (pos,(GenerateBlockSymbol **)ctx,ppGVar4 + 1);
  }
  SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::cleanup
            ((SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(GenerateBlockSymbol ***)this = __result;
  return ppGVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}